

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

bool deqp::gls::StateQueryUtil::verifyBooleanValidity(ResultCollector *result,GLboolean v)

{
  ostream *poVar1;
  Hex<2UL> *value;
  string local_1f0;
  Hex<2UL> local_1d0;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream buf;
  GLboolean v_local;
  ResultCollector *result_local;
  
  if ((v == '\x01') || (v == '\0')) {
    result_local._7_1_ = true;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,
                             "Boolean value was not neither GL_TRUE nor GL_FALSE, got ");
    tcu::Format::Hex<2UL>::Hex(&local_1d0,(ulong)v);
    de::toString<tcu::Format::Hex<2ul>>(&local_1c8,(de *)&local_1d0,value);
    std::operator<<(poVar1,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::str();
    tcu::ResultCollector::fail(result,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    result_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return result_local._7_1_;
}

Assistant:

static bool verifyBooleanValidity (tcu::ResultCollector& result, glw::GLboolean v)
{
	if (v == GL_TRUE || v == GL_FALSE)
		return true;
	else
	{
		std::ostringstream buf;
		buf << "Boolean value was not neither GL_TRUE nor GL_FALSE, got " << de::toString(tcu::Format::Hex<2>(v));
		result.fail(buf.str());
		return false;
	}
}